

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode expect100(Curl_easy *data,connectdata *conn,dynbuf *req)

{
  _Bool _Var1;
  uint uVar2;
  CURLcode CVar3;
  char *headerline;
  
  uVar2 = *(uint *)&(data->state).field_0x6d0;
  *(uint *)&(data->state).field_0x6d0 = uVar2 & 0xffffff7f;
  if (((((uVar2 >> 8 & 1) == 0) && ((data->state).httpversion != '\n')) && (conn->httpversion != 10)
      ) && (conn->httpversion < 0x14 && (data->state).httpwant != '\x01')) {
    headerline = Curl_checkheaders(data,"Expect",6);
    if (headerline == (char *)0x0) {
      CVar3 = Curl_dyn_addn(req,"Expect: 100-continue\r\n",0x16);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      uVar2 = *(uint *)&(data->state).field_0x6d0 | 0x80;
    }
    else {
      _Var1 = Curl_compareheader(headerline,"Expect:",7,"100-continue",0xc);
      uVar2 = *(uint *)&(data->state).field_0x6d0 & 0xffffff7f | (uint)_Var1 << 7;
    }
    *(uint *)&(data->state).field_0x6d0 = uVar2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode expect100(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct dynbuf *req)
{
  CURLcode result = CURLE_OK;
  data->state.expect100header = FALSE; /* default to false unless it is set
                                          to TRUE below */
  if(!data->state.disableexpect && Curl_use_http_1_1plus(data, conn) &&
     (conn->httpversion < 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    const char *ptr = Curl_checkheaders(data, STRCONST("Expect"));
    if(ptr) {
      data->state.expect100header =
        Curl_compareheader(ptr, STRCONST("Expect:"), STRCONST("100-continue"));
    }
    else {
      result = Curl_dyn_addn(req, STRCONST("Expect: 100-continue\r\n"));
      if(!result)
        data->state.expect100header = TRUE;
    }
  }

  return result;
}